

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableEnumOneofFieldLiteGenerator::
ImmutableEnumOneofFieldLiteGenerator
          (ImmutableEnumOneofFieldLiteGenerator *this,FieldDescriptor *descriptor,
          int messageBitIndex,Context *context)

{
  OneofDescriptor *oneof;
  OneofGeneratorInfo *info_00;
  OneofGeneratorInfo *info;
  Context *context_local;
  int messageBitIndex_local;
  FieldDescriptor *descriptor_local;
  ImmutableEnumOneofFieldLiteGenerator *this_local;
  
  ImmutableEnumFieldLiteGenerator::ImmutableEnumFieldLiteGenerator
            (&this->super_ImmutableEnumFieldLiteGenerator,descriptor,messageBitIndex,context);
  (this->super_ImmutableEnumFieldLiteGenerator).super_ImmutableFieldLiteGenerator.
  super_FieldGenerator._vptr_FieldGenerator =
       (_func_int **)&PTR__ImmutableEnumOneofFieldLiteGenerator_00efd248;
  oneof = FieldDescriptor::containing_oneof(descriptor);
  info_00 = Context::GetOneofGeneratorInfo(context,oneof);
  SetCommonOneofVariables
            (descriptor,info_00,&(this->super_ImmutableEnumFieldLiteGenerator).variables_);
  return;
}

Assistant:

ImmutableEnumOneofFieldLiteGenerator::ImmutableEnumOneofFieldLiteGenerator(
    const FieldDescriptor* descriptor, int messageBitIndex, Context* context)
    : ImmutableEnumFieldLiteGenerator(descriptor, messageBitIndex, context) {
  const OneofGeneratorInfo* info =
      context->GetOneofGeneratorInfo(descriptor->containing_oneof());
  SetCommonOneofVariables(descriptor, info, &variables_);
}